

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboNoAttachmentTests.cpp
# Opt level: O3

bool deqp::gles31::Functional::anon_unknown_0::checkFramebufferRenderable
               (TestLog *log,RenderContext *renderCtx,GLuint framebuffer,IVec2 *size)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this;
  long lVar3;
  bool bVar4;
  GLuint vertexBuffer;
  GLuint vertexArray;
  GLuint query;
  ProgramSources sources;
  ShaderProgram program;
  undefined4 local_2d0;
  GLuint local_2cc;
  value_type local_2c8;
  value_type local_2a8;
  undefined1 local_288 [8];
  undefined4 uStack_280;
  undefined4 uStack_27c;
  pointer local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_270 [4];
  ios_base local_210 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_1f8;
  undefined1 local_1d8 [216];
  ShaderProgram local_100;
  long lVar2;
  
  iVar1 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a8,
             "#version 310 es\nin layout(location = 0) highp vec2 a_position;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n}\n"
             ,"");
  local_2cc = framebuffer;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c8,
             "#version 310 es\nout layout(location = 0) mediump vec4 f_color;\n\nvoid main()\n{\n\tf_color = vec4(1.0, 0.5, 0.25, 1.0);\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_288,0,0xac);
  local_1d8._0_8_ = (pointer)0x0;
  local_1d8[8] = 0;
  local_1d8._9_7_ = 0;
  local_1d8[0x10] = 0;
  local_1d8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_288,&local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(avStack_270,&local_2c8);
  glu::ShaderProgram::ShaderProgram(&local_100,renderCtx,(ProgramSources *)local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_1f8);
  lVar3 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_288 + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  local_2a8._M_dataplus._M_p = local_2a8._M_dataplus._M_p & 0xffffffff00000000;
  if (local_100.m_program.m_info.linkOk == false) {
    glu::operator<<(log,&local_100);
  }
  if ((local_100.m_program.m_info.linkOk & 1U) == 0) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,(char *)0x0,"program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
               ,0xc6);
  }
  else {
    (**(code **)(lVar2 + 0x1680))(local_100.m_program.m_program);
    (**(code **)(lVar2 + 0x5e0))(0xb71);
    (**(code **)(lVar2 + 0x4a0))(0x207);
    (**(code **)(lVar2 + 0x78))(0x8ca9);
    (**(code **)(lVar2 + 0x1a00))(0,0,size->m_data[0],size->m_data[1]);
    iVar1 = (**(code **)(lVar2 + 0x170))(0x8ca9);
    if (iVar1 == 0x8cd5) {
      local_288 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_280,
                 "Rendering full framebuffer quad with color ouput, verifying output presence with occlusion query"
                 ,0x60);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
      std::ios_base::~ios_base(local_210);
      avStack_270[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xbf8000003f800000;
      avStack_270[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xbf800000bf800000;
      local_278 = (pointer)0x3f800000bf800000;
      avStack_270[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f800000bf800000;
      local_288 = (undefined1  [8])0x3f8000003f800000;
      uStack_280 = 0x3f800000;
      uStack_27c = 0xbf800000;
      local_2c8._M_dataplus._M_p = local_2c8._M_dataplus._M_p & 0xffffffff00000000;
      local_2d0 = 0;
      (**(code **)(lVar2 + 0x6e0))(1,&local_2a8);
      (**(code **)(lVar2 + 0x708))(1,&local_2c8);
      (**(code **)(lVar2 + 0xd8))((ulong)local_2c8._M_dataplus._M_p & 0xffffffff);
      (**(code **)(lVar2 + 0x6c8))(1,&local_2d0);
      (**(code **)(lVar2 + 0x40))(0x8892,local_2d0);
      (**(code **)(lVar2 + 0x150))(0x8892,0x30,local_288,0x88e4);
      (**(code **)(lVar2 + 0x610))(0);
      (**(code **)(lVar2 + 0x19f0))(0,2,0x1406,0,0,0);
      (**(code **)(lVar2 + 0x20))(0x8c2f,(ulong)local_2a8._M_dataplus._M_p & 0xffffffff);
      (**(code **)(lVar2 + 0x538))(4,0,6);
      (**(code **)(lVar2 + 0x628))(0x8c2f);
      (**(code **)(lVar2 + 0x518))(0);
      (**(code **)(lVar2 + 0x40))(0x8892,0);
      (**(code **)(lVar2 + 0xd8))(0);
      (**(code **)(lVar2 + 0x438))(1,&local_2d0);
      (**(code **)(lVar2 + 0x490))(1,&local_2c8);
      local_2c8._M_dataplus._M_p = local_2c8._M_dataplus._M_p & 0xffffffff00000000;
      (**(code **)(lVar2 + 0xa20))((ulong)local_2a8._M_dataplus._M_p & 0xffffffff,0x8866);
      (**(code **)(lVar2 + 0x458))(1,&local_2a8);
      err = (**(code **)(lVar2 + 0x800))();
      glu::checkError(err,"Query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
                      ,0xfe);
      if ((int)local_2c8._M_dataplus._M_p == 0) {
        local_288 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_280,"Query did not pass",0x12);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_288 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_280,"Query passed",0xc);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_288,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_280);
      std::ios_base::~ios_base(local_210);
      bVar4 = (int)local_2c8._M_dataplus._M_p != 0;
      glu::ShaderProgram::~ShaderProgram(&local_100);
      return bVar4;
    }
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,(char *)0x0,
               "gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboNoAttachmentTests.cpp"
               ,0xce);
  }
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool checkFramebufferRenderable (TestLog& log, const glu::RenderContext& renderCtx, GLuint framebuffer, const IVec2& size)
{
	const glw::Functions&		gl				= renderCtx.getFunctions();

	const char* const			vertexSource	= "#version 310 es\n"
												  "in layout(location = 0) highp vec2 a_position;\n\n"
												  "void main()\n"
												  "{\n"
												  "	gl_Position = vec4(a_position, 0.0, 1.0);\n"
												  "}\n";

	const char* const			fragmentSource	= "#version 310 es\n"
												  "out layout(location = 0) mediump vec4 f_color;\n\n"
												  "void main()\n"
												  "{\n"
												  "	f_color = vec4(1.0, 0.5, 0.25, 1.0);\n"
												  "}\n";

	const glu::ShaderProgram	program			(renderCtx, glu::makeVtxFragSources(vertexSource, fragmentSource));
	GLuint						query			= 0;

	if (!program.isOk())
		log << program;

	TCU_CHECK(program.isOk());

	gl.useProgram(program.getProgram());
	gl.enable(GL_DEPTH_TEST);
	gl.depthFunc(GL_ALWAYS);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, framebuffer);
	gl.viewport(0, 0, size.x(), size.y());

	TCU_CHECK(gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	log << TestLog::Message << "Rendering full framebuffer quad with color ouput, verifying output presence with occlusion query" << TestLog::EndMessage;

	// Render
	{
		const float data[] =
		{
			 1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f,  1.0f,
			-1.0f,  1.0f,
			 1.0f, -1.0f,
			-1.0f, -1.0f,
		};

		GLuint vertexArray	= 0;
		GLuint vertexBuffer	= 0;

		gl.genQueries(1, &query);
		gl.genVertexArrays(1, &vertexArray);
		gl.bindVertexArray(vertexArray);

		gl.genBuffers(1, &vertexBuffer);
		gl.bindBuffer(GL_ARRAY_BUFFER, vertexBuffer);
		gl.bufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		gl.enableVertexAttribArray(0);
		gl.vertexAttribPointer(0, 2, GL_FLOAT, false, 0, DE_NULL);

		gl.beginQuery(GL_ANY_SAMPLES_PASSED, query);
		gl.drawArrays(GL_TRIANGLES, 0, 6);
		gl.endQuery(GL_ANY_SAMPLES_PASSED);

		gl.disableVertexAttribArray(0);
		gl.bindBuffer(GL_ARRAY_BUFFER, 0);
		gl.bindVertexArray(0);
		gl.deleteBuffers(1, &vertexBuffer);
		gl.deleteVertexArrays(1, &vertexArray);
	}

	// Read
	{
		GLuint passed = 0;

		gl.getQueryObjectuiv(query, GL_QUERY_RESULT, &passed);
		gl.deleteQueries(1, &query);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		if (passed)
			log << TestLog::Message << "Query passed" << TestLog::EndMessage;
		else
			log << TestLog::Message << "Query did not pass" << TestLog::EndMessage;

		return passed != 0;
	}
}